

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O2

unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true> __thiscall
duckdb::WriteAheadLog::Replay
          (WriteAheadLog *this,FileSystem *fs,AttachedDatabase *db,string *wal_path)

{
  bool bVar1;
  FileOpenFlags FVar2;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_40;
  _func_int **local_38;
  AttachedDatabase *local_30;
  
  FVar2.lock = NO_LOCK;
  FVar2.compression = UNCOMPRESSED;
  FVar2._10_6_ = 0;
  FVar2.flags = 0x80;
  FVar2 = FileOpenFlags::operator|((FileOpenFlags *)FileFlags::FILE_FLAGS_READ,FVar2);
  (*fs->_vptr_FileSystem[2])(&stack0xffffffffffffffd0,fs,wal_path,FVar2.flags,(ulong)FVar2._8_2_,0);
  if (local_30 == (AttachedDatabase *)0x0) {
    make_uniq<duckdb::WriteAheadLog,duckdb::AttachedDatabase&,std::__cxx11::string_const&>
              ((duckdb *)this,db,wal_path);
  }
  else {
    local_40._M_head_impl = (FileHandle *)local_30;
    local_30 = (AttachedDatabase *)0x0;
    ReplayInternal((WriteAheadLog *)&stack0xffffffffffffffc8,db,
                   (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
                   &local_40);
    if (local_40._M_head_impl != (FileHandle *)0x0) {
      (*(local_40._M_head_impl)->_vptr_FileHandle[1])();
    }
    local_40._M_head_impl = (FileHandle *)0x0;
    if (local_38 == (_func_int **)0x0) {
      bVar1 = AttachedDatabase::IsReadOnly(db);
      if (!bVar1) {
        (*fs->_vptr_FileSystem[0x14])(fs,wal_path,0);
      }
      make_uniq<duckdb::WriteAheadLog,duckdb::AttachedDatabase&,std::__cxx11::string_const&>
                ((duckdb *)this,db,wal_path);
      if (local_38 != (_func_int **)0x0) {
        (**(code **)(*local_38 + 8))();
      }
    }
    else {
      this->_vptr_WriteAheadLog = local_38;
    }
  }
  if (local_30 != (AttachedDatabase *)0x0) {
    (*(local_30->super_CatalogEntry)._vptr_CatalogEntry[1])();
  }
  return (unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>)
         (unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>)this;
}

Assistant:

unique_ptr<WriteAheadLog> WriteAheadLog::Replay(FileSystem &fs, AttachedDatabase &db, const string &wal_path) {
	auto handle = fs.OpenFile(wal_path, FileFlags::FILE_FLAGS_READ | FileFlags::FILE_FLAGS_NULL_IF_NOT_EXISTS);
	if (!handle) {
		// WAL does not exist - instantiate an empty WAL
		return make_uniq<WriteAheadLog>(db, wal_path);
	}
	auto wal_handle = ReplayInternal(db, std::move(handle));
	if (wal_handle) {
		return wal_handle;
	}
	// replay returning NULL indicates we can nuke the WAL entirely - but only if this is not a read-only connection
	if (!db.IsReadOnly()) {
		fs.RemoveFile(wal_path);
	}
	return make_uniq<WriteAheadLog>(db, wal_path);
}